

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv__iou_fs_symlink(uv_loop_t *loop,uv_fs_t *req)

{
  uv__io_uring_sqe *puVar1;
  uv__iou *iou;
  int iVar2;
  
  iVar2 = 0;
  if ((*(byte *)((long)loop->internal_fields + 0x1d0) & 1) != 0) {
    iou = (uv__iou *)((long)loop->internal_fields + 0x150);
    puVar1 = uv__iou_get_sqe(iou,loop,req);
    iVar2 = 0;
    if (puVar1 != (uv__io_uring_sqe *)0x0) {
      puVar1->field_5 = (anon_union_8_1_898948ef_for_uv__io_uring_sqe_6)req->path;
      puVar1->fd = -100;
      puVar1->field_4 = (anon_union_8_2_0677c74f_for_uv__io_uring_sqe_4)req->new_path;
      puVar1->opcode = '&';
      uv__iou_submit(iou);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int uv__iou_fs_symlink(uv_loop_t* loop, uv_fs_t* req) {
  struct uv__io_uring_sqe* sqe;
  struct uv__iou* iou;

  iou = &uv__get_internal_fields(loop)->iou;

  if (!(iou->flags & UV__MKDIRAT_SYMLINKAT_LINKAT))
    return 0;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL)
    return 0;

  sqe->addr = (uintptr_t) req->path;
  sqe->fd = AT_FDCWD;
  sqe->addr2 = (uintptr_t) req->new_path;
  sqe->opcode = UV__IORING_OP_SYMLINKAT;

  uv__iou_submit(iou);

  return 1;
}